

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O0

void sqlcheck::CheckStatement(Configuration *state,string *sql_statement)

{
  char *pcVar1;
  string *psVar2;
  ulong uVar3;
  ulong local_b8;
  size_t i;
  undefined1 local_a8 [7];
  bool print_statement;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char *local_68;
  char *local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_38 [8];
  string statement;
  string *sql_statement_local;
  Configuration *state_local;
  
  statement.field_2._8_8_ = sql_statement;
  std::__cxx11::string::string((string *)local_38,(string *)sql_statement);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48._M_current = (char *)std::__cxx11::string::end();
  local_50 = (char *)std::__cxx11::string::begin();
  local_68 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (local_40,local_48,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_50,tolower);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_a8,"^ +| +$|( ) +",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_a8,"$1",0);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_a8);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  if (*pcVar1 == '\n') {
    psVar2 = (string *)std::__cxx11::string::erase((ulong)local_38,0);
    std::__cxx11::string::operator=((string *)local_38,psVar2);
    state->line_number = state->line_number + 1;
  }
  i._7_1_ = 1;
  CheckMultiValuedAttribute(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckRecursiveDependency(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckPrimaryKeyExists(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckGenericPrimaryKey(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckForeignKeyExists(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckVariableAttribute(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckMetadataTribbles(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckFloat(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckValuesInDefinition(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckExternalFiles(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckIndexCount(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckIndexAttributeOrder(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckSelectStar(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckJoinWithoutEquality(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckNullUsage(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckNotNullUsage(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckConcatenation(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckGroupByUsage(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckOrderByRand(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckPatternMatching(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckSpaghettiQuery(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckJoinCount(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckDistinctCount(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckImplicitColumns(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckHaving(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckNesting(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckOr(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckUnion(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckDistinctJoin(state,(string *)local_38,(bool *)((long)&i + 7));
  CheckReadablePasswords(state,(string *)local_38,(bool *)((long)&i + 7));
  local_b8 = 0;
  while( true ) {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= local_b8) break;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar1 == '\n') {
      state->line_number = state->line_number + 1;
    }
    local_b8 = local_b8 + 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void CheckStatement(Configuration& state,
                    const std::string& sql_statement){

  // TRANSFORM TO LOWER CASE
  auto statement = sql_statement;

  std::transform(statement.begin(),
                 statement.end(),
                 statement.begin(),
                 ::tolower);

  // REMOVE SPACE
  statement = std::regex_replace(statement, std::regex("^ +| +$|( ) +"), "$1");

  // CHECK FOR LEADING NEWLINE
  if (statement[0] == '\n') {
    statement = statement.erase(0,1);
    state.line_number++;
  }

  // RESET
  bool print_statement = true;

  // LOGICAL DATABASE DESIGN

  CheckMultiValuedAttribute(state, statement, print_statement);

  CheckRecursiveDependency(state, statement, print_statement);

  CheckPrimaryKeyExists(state, statement, print_statement);

  CheckGenericPrimaryKey(state, statement, print_statement);

  CheckForeignKeyExists(state, statement, print_statement);

  CheckVariableAttribute(state, statement, print_statement);

  CheckMetadataTribbles(state, statement, print_statement);

  // PHYSICAL DATABASE DESIGN

  CheckFloat(state, statement, print_statement);

  CheckValuesInDefinition(state, statement, print_statement);

  CheckExternalFiles(state, statement, print_statement);

  CheckIndexCount(state, statement, print_statement);

  CheckIndexAttributeOrder(state, statement, print_statement);

  // QUERY

  CheckSelectStar(state, statement, print_statement);

  CheckJoinWithoutEquality(state, statement, print_statement);

  CheckNullUsage(state, statement, print_statement);

  CheckNotNullUsage(state, statement, print_statement);

  CheckConcatenation(state, statement, print_statement);

  CheckGroupByUsage(state, statement, print_statement);

  CheckOrderByRand(state, statement, print_statement);

  CheckPatternMatching(state, statement, print_statement);

  CheckSpaghettiQuery(state, statement, print_statement);

  CheckJoinCount(state, statement, print_statement);

  CheckDistinctCount(state, statement, print_statement);

  CheckImplicitColumns(state, statement, print_statement);

  CheckHaving(state, statement, print_statement);

  CheckNesting(state, statement, print_statement);

  CheckOr(state, statement, print_statement);

  CheckUnion(state, statement, print_statement);

  CheckDistinctJoin(state, statement, print_statement);

  // APPLICATION

  CheckReadablePasswords(state, statement, print_statement);




  // update state.line_number with number of line breaks in the statement that was just checked
  for (size_t i = 0; i < statement.length(); i++)
  {
      if (statement[i] == '\n')
      {
          state.line_number++;
      }
  }
}